

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_read_set_filter_option.c
# Opt level: O2

void test(int pristine)

{
  wchar_t wVar1;
  longlong v1;
  int iVar2;
  archive *_a;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  
  _a = archive_write_new();
  v1 = -0x19;
  if (pristine == 0) {
    archive_write_add_filter_gzip(_a);
    archive_write_set_format_iso9660(_a);
    v1 = 0;
  }
  iVar2 = archive_write_set_options(_a,(char *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_options.c"
                      ,L'.',0,"0",(long)iVar2,"archive_write_set_options(a, ((void*)0))",(void *)0x0
                     );
  iVar2 = archive_write_set_options(_a,"");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_options.c"
                      ,L'/',0,"0",(long)iVar2,"archive_write_set_options(a, \"\")",(void *)0x0);
  iVar2 = archive_write_set_options(_a,"fubar:snafu");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_options.c"
                      ,L'2',-0x19,"(-25)",(long)iVar2,
                      "archive_write_set_options(a, \"fubar:snafu\")",(void *)0x0);
  pcVar3 = archive_error_string(_a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_options.c"
             ,L'4',"Unknown module name: `fubar\'","\"Unknown module name: `fubar\'\"",pcVar3,
             "archive_error_string(a)",(void *)0x0,L'\0');
  iVar2 = archive_write_set_options(_a,"fubar:snafu=betcha");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_options.c"
                      ,L'5',-0x19,"(-25)",(long)iVar2,
                      "archive_write_set_options(a, \"fubar:snafu=betcha\")",(void *)0x0);
  pcVar3 = archive_error_string(_a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_options.c"
             ,L'7',"Unknown module name: `fubar\'","\"Unknown module name: `fubar\'\"",pcVar3,
             "archive_error_string(a)",(void *)0x0,L'\0');
  iVar2 = archive_write_set_options(_a,"snafu");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_options.c"
                      ,L':',-0x19,"(-25)",(long)iVar2,"archive_write_set_options(a, \"snafu\")",
                      (void *)0x0);
  pcVar3 = archive_error_string(_a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_options.c"
             ,L'<',"Undefined option: `snafu\'","\"Undefined option: `snafu\'\"",pcVar3,
             "archive_error_string(a)",(void *)0x0,L'\0');
  iVar2 = archive_write_set_options(_a,"snafu=betcha");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_options.c"
                      ,L'=',-0x19,"(-25)",(long)iVar2,
                      "archive_write_set_options(a, \"snafu=betcha\")",(void *)0x0);
  pcVar3 = archive_error_string(_a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_options.c"
             ,L'?',"Undefined option: `snafu\'","\"Undefined option: `snafu\'\"",pcVar3,
             "archive_error_string(a)",(void *)0x0,L'\0');
  iVar2 = archive_write_set_options(_a,"iso9660:joliet");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_options.c"
                      ,L'B',v1,"known_option_rv",(long)iVar2,
                      "archive_write_set_options(a, \"iso9660:joliet\")",(void *)0x0);
  if (pristine == 0) {
    iVar2 = archive_write_set_options(_a,"iso9660:joliet");
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_options.c"
                        ,L'G',0,"known_option_rv",(long)iVar2,
                        "archive_write_set_options(a, \"iso9660:joliet\")",(void *)0x0);
  }
  else {
    pcVar3 = archive_error_string(_a);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_options.c"
               ,L'E',"Unknown module name: `iso9660\'","\"Unknown module name: `iso9660\'\"",pcVar3,
               "archive_error_string(a)",(void *)0x0,L'\0');
    iVar2 = archive_write_set_options(_a,"iso9660:joliet");
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_options.c"
                        ,L'G',-0x19,"known_option_rv",(long)iVar2,
                        "archive_write_set_options(a, \"iso9660:joliet\")",(void *)0x0);
    pcVar3 = archive_error_string(_a);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_options.c"
               ,L'J',"Unknown module name: `iso9660\'","\"Unknown module name: `iso9660\'\"",pcVar3,
               "archive_error_string(a)",(void *)0x0,L'\0');
  }
  iVar2 = archive_write_set_options(_a,"joliet");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_options.c"
                      ,L'L',v1,"known_option_rv",(long)iVar2,
                      "archive_write_set_options(a, \"joliet\")",(void *)0x0);
  if (pristine == 0) {
    iVar2 = archive_write_set_options(_a,"!joliet");
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_options.c"
                        ,L'Q',0,"known_option_rv",(long)iVar2,
                        "archive_write_set_options(a, \"!joliet\")",(void *)0x0);
  }
  else {
    pcVar3 = archive_error_string(_a);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_options.c"
               ,L'O',"Undefined option: `joliet\'","\"Undefined option: `joliet\'\"",pcVar3,
               "archive_error_string(a)",(void *)0x0,L'\0');
    iVar2 = archive_write_set_options(_a,"!joliet");
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_options.c"
                        ,L'Q',-0x19,"known_option_rv",(long)iVar2,
                        "archive_write_set_options(a, \"!joliet\")",(void *)0x0);
    pcVar3 = archive_error_string(_a);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_options.c"
               ,L'T',"Undefined option: `joliet\'","\"Undefined option: `joliet\'\"",pcVar3,
               "archive_error_string(a)",(void *)0x0,L'\0');
  }
  iVar2 = archive_write_set_options(_a,",");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_options.c"
                      ,L'W',0,"0",(long)iVar2,"archive_write_set_options(a, \",\")",(void *)0x0);
  iVar2 = archive_write_set_options(_a,",,");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_options.c"
                      ,L'X',0,"0",(long)iVar2,"archive_write_set_options(a, \",,\")",(void *)0x0);
  iVar2 = archive_write_set_options(_a,",joliet");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_options.c"
                      ,L'Z',v1,"halfempty_options_rv",(long)iVar2,
                      "archive_write_set_options(a, \",joliet\")",(void *)0x0);
  if (pristine == 0) {
    iVar2 = archive_write_set_options(_a,"joliet,");
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_options.c"
                        ,L'_',0,"halfempty_options_rv",(long)iVar2,
                        "archive_write_set_options(a, \"joliet,\")",(void *)0x0);
  }
  else {
    pcVar3 = archive_error_string(_a);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_options.c"
               ,L']',"Undefined option: `joliet\'","\"Undefined option: `joliet\'\"",pcVar3,
               "archive_error_string(a)",(void *)0x0,L'\0');
    iVar2 = archive_write_set_options(_a,"joliet,");
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_options.c"
                        ,L'_',-0x19,"halfempty_options_rv",(long)iVar2,
                        "archive_write_set_options(a, \"joliet,\")",(void *)0x0);
    pcVar3 = archive_error_string(_a);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_options.c"
               ,L'b',"Undefined option: `joliet\'","\"Undefined option: `joliet\'\"",pcVar3,
               "archive_error_string(a)",(void *)0x0,L'\0');
  }
  iVar2 = archive_write_set_options(_a,"joliet,snafu");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_options.c"
                      ,L'e',-0x19,"(-25)",(long)iVar2,
                      "archive_write_set_options(a, \"joliet,snafu\")",(void *)0x0);
  pcVar3 = archive_error_string(_a);
  if (pristine == 0) {
    pcVar5 = "Undefined option: `snafu\'";
    pcVar4 = "\"Undefined option: `snafu\'\"";
    wVar1 = L'k';
  }
  else {
    pcVar5 = "Undefined option: `joliet\'";
    pcVar4 = "\"Undefined option: `joliet\'\"";
    wVar1 = L'h';
  }
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_options.c"
             ,wVar1,pcVar5,pcVar4,pcVar3,"archive_error_string(a)",(void *)0x0,L'\0');
  iVar2 = archive_write_set_options(_a,"iso9660:snafu");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_options.c"
                      ,L'n',-0x19,"(-25)",(long)iVar2,
                      "archive_write_set_options(a, \"iso9660:snafu\")",(void *)0x0);
  pcVar3 = archive_error_string(_a);
  if (pristine == 0) {
    pcVar5 = "Undefined option: `iso9660:snafu\'";
    pcVar4 = "\"Undefined option: `iso9660:snafu\'\"";
    wVar1 = L't';
  }
  else {
    pcVar5 = "Unknown module name: `iso9660\'";
    pcVar4 = "\"Unknown module name: `iso9660\'\"";
    wVar1 = L'q';
  }
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_options.c"
             ,wVar1,pcVar5,pcVar4,pcVar3,"archive_error_string(a)",(void *)0x0,L'\0');
  archive_write_free(_a);
  return;
}

Assistant:

static void
test(int pristine)
{
	struct archive* a = archive_read_new();

	if (!pristine)
		archive_read_support_filter_all(a);

	should(a, ARCHIVE_OK, NULL, NULL, NULL);
	should(a, ARCHIVE_OK, "", "", "");

	should(a, ARCHIVE_FAILED, NULL, "fubar", NULL);
	should(a, ARCHIVE_FAILED, NULL, "fubar", "snafu");
	should(a, ARCHIVE_FAILED, "fubar", "snafu", NULL);
	should(a, ARCHIVE_FAILED, "fubar", "snafu", "betcha");

	archive_read_free(a);
}